

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

Vec_Int_t * Abc_FrameDeriveStatusArray2(Vec_Ptr_t *vCexes)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  int *__ptr;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  size_t __size;
  ulong uVar8;
  
  if (vCexes == (Vec_Ptr_t *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  uVar1 = vCexes->nSize;
  uVar8 = (ulong)uVar1;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  pVVar4->nCap = uVar7;
  if (uVar7 == 0) {
    pVVar4->pArray = (int *)0x0;
    if ((int)uVar1 < 1) goto LAB_00247a19;
    __size = uVar8 * 4;
LAB_00247982:
    __ptr = (int *)malloc(__size);
LAB_0024798a:
    pVVar4->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = uVar1;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar7 << 2);
    pVVar4->pArray = __ptr;
    if ((int)uVar7 < (int)uVar1) {
      __size = (long)(int)uVar1 << 2;
      if (__ptr == (int *)0x0) goto LAB_00247982;
      __ptr = (int *)realloc(__ptr,__size);
      goto LAB_0024798a;
    }
  }
  if (0 < (int)uVar1) {
    memset(__ptr,0xff,uVar8 * 4);
    uVar7 = vCexes->nSize;
    uVar6 = (ulong)uVar7;
    pVVar4->nSize = uVar1;
    if ((int)uVar7 < 1) {
      return pVVar4;
    }
    uVar5 = 0;
    do {
      ppvVar2 = vCexes->pArray;
      pvVar3 = ppvVar2[uVar5];
      if (pvVar3 != (void *)0x0) {
        if (pvVar3 == (void *)0x1) {
          if (uVar8 <= uVar5) {
LAB_00247a29:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar4->pArray[uVar5] = 1;
          uVar6 = (ulong)vCexes->nSize;
          if ((long)uVar6 <= (long)uVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          ppvVar2[uVar5] = (void *)0x0;
        }
        else {
          if (uVar8 <= uVar5) goto LAB_00247a29;
          pVVar4->pArray[uVar5] = 0;
          uVar6 = (ulong)(uint)vCexes->nSize;
        }
      }
      uVar5 = uVar5 + 1;
      if ((long)(int)uVar6 <= (long)uVar5) {
        return pVVar4;
      }
    } while( true );
  }
LAB_00247a19:
  pVVar4->nSize = uVar1;
  return pVVar4;
}

Assistant:

Vec_Int_t * Abc_FrameDeriveStatusArray2( Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vStatuses;
    Abc_Cex_t * pCex;
    int i;
    if ( vCexes == NULL )
        return NULL;
    vStatuses = Vec_IntAlloc( Vec_PtrSize(vCexes) );
    Vec_IntFill( vStatuses, Vec_PtrSize(vCexes), -1 ); // assume UNDEC
    Vec_PtrForEachEntry( Abc_Cex_t *, vCexes, pCex, i )
        if ( pCex == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
        {
            Vec_IntWriteEntry( vStatuses, i, 1 ); // set this output as UNSAT
            Vec_PtrWriteEntry( vCexes, i, NULL );
        }
        else if ( pCex != NULL )
            Vec_IntWriteEntry( vStatuses, i, 0 ); // set this output as SAT
    return vStatuses;
}